

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compact.cpp
# Opt level: O3

void print_usage(string *exec_name)

{
  undefined1 auVar1 [16];
  string_view format_str;
  string_view format_str_00;
  format_args args;
  pointer local_28;
  size_type sStack_20;
  
  local_28 = (exec_name->_M_dataplus)._M_p;
  sStack_20 = exec_name->_M_string_length;
  format_str.size_ = 0x25;
  format_str.data_ = "Usage: {} [option] /path/to/database\n";
  args.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        *)&local_28;
  args.
  super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  .types_ = 0xe;
  fmt::v6::vprint(_stderr,format_str,args);
  local_28 = (pointer)0x0;
  format_str_00.size_ = 0x34;
  format_str_00.data_ = "    [-1]     compact a single round, default: false\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_28;
  fmt::v6::vprint(_stderr,format_str_00,(format_args)(auVar1 << 0x40));
  return;
}

Assistant:

void print_usage(const std::string &exec_name) {
    // clang-format off
    fmt::print(stderr, "Usage: {} [option] /path/to/database\n", exec_name);
    fmt::print(stderr, "    [-1]     compact a single round, default: false\n");
    // clang-format on
}